

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

int compareStringsInUtf8(QStringView lhs,QStringView rhs,Comparison mode)

{
  storage_type_conflict *psVar1;
  storage_type_conflict sVar2;
  uint uVar3;
  long lVar4;
  storage_type_conflict *psVar5;
  storage_type_conflict *psVar6;
  uint uVar7;
  long lVar8;
  storage_type_conflict *psVar9;
  storage_type_conflict *psVar10;
  long lVar11;
  long lVar12;
  storage_type_conflict *psVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  
  if (mode == ForEquality) {
    uVar3 = 1;
    if (lhs.m_size == rhs.m_size) {
      bVar16 = QtPrivate::equalStrings(lhs,rhs);
      uVar3 = (uint)!bVar16;
    }
  }
  else {
    psVar13 = lhs.m_data + lhs.m_size;
    psVar1 = rhs.m_data + rhs.m_size;
    lVar4 = 0;
    lVar11 = 0;
    lVar12 = 0;
    psVar5 = rhs.m_data;
    psVar9 = lhs.m_data;
    do {
      psVar10 = psVar9 + 1;
      sVar2 = *psVar9;
      uVar7 = (uint)(ushort)sVar2;
      if ((ushort)sVar2 < 0x800) {
        lVar8 = (ulong)(0x7f < (ushort)sVar2) + 1;
      }
      else {
        lVar8 = 3;
        if (psVar10 != psVar13 && (sVar2 & 0xfc00U) == 0xd800) {
          psVar10 = psVar9 + 2;
          uVar7 = (uint)(ushort)sVar2 * 0x400 + (uint)(ushort)psVar9[1] + 0xfca02400;
          lVar8 = 4;
        }
      }
      psVar6 = psVar5 + 1;
      sVar2 = *psVar5;
      uVar14 = (uint)(ushort)sVar2;
      if ((ushort)sVar2 < 0x800) {
        lVar15 = (ulong)(0x7f < (ushort)sVar2) + 1;
      }
      else {
        lVar15 = 3;
        if (psVar6 != psVar1 && (sVar2 & 0xfc00U) == 0xd800) {
          psVar6 = psVar5 + 2;
          uVar14 = (uint)(ushort)sVar2 * 0x400 + (uint)(ushort)psVar5[1] + 0xfca02400;
          lVar15 = 4;
        }
      }
      lVar11 = lVar11 + lVar15;
      lVar12 = lVar12 + lVar8;
      if (psVar13 <= psVar10) goto LAB_002ec7cd;
    } while ((psVar6 < psVar1) && (psVar5 = psVar6, psVar9 = psVar10, uVar7 == uVar14));
    lVar4 = 0;
    while (psVar10 < psVar13) {
      psVar5 = psVar10 + 1;
      sVar2 = *psVar10;
      if ((ushort)sVar2 < 0x800) {
        lVar8 = (ulong)(0x7f < (ushort)sVar2) + 1;
      }
      else {
        bVar16 = (sVar2 & 0xfc00U) != 0xd800;
        bVar17 = psVar5 == psVar13;
        if (!bVar17 && !bVar16) {
          psVar5 = psVar10 + 2;
        }
        lVar8 = 4 - (ulong)(bVar17 || bVar16);
      }
      lVar4 = lVar4 + lVar8;
      psVar10 = psVar5;
    }
LAB_002ec7cd:
    lVar4 = lVar4 + lVar12;
    lVar12 = 0;
    while (psVar6 < psVar1) {
      psVar13 = psVar6 + 1;
      sVar2 = *psVar6;
      if ((ushort)sVar2 < 0x800) {
        lVar8 = (ulong)(0x7f < (ushort)sVar2) + 1;
      }
      else {
        bVar16 = (sVar2 & 0xfc00U) != 0xd800;
        bVar17 = psVar13 == psVar1;
        if (!bVar17 && !bVar16) {
          psVar13 = psVar6 + 2;
        }
        lVar8 = 4 - (ulong)(bVar17 || bVar16);
      }
      lVar12 = lVar12 + lVar8;
      psVar6 = psVar13;
    }
    lVar12 = lVar12 + lVar11;
    uVar3 = ((lVar12 <= lVar4) - 1) + (uint)(lVar12 <= lVar4);
    if (lVar4 == lVar12) {
      uVar3 = uVar7 - uVar14;
    }
  }
  return uVar3;
}

Assistant:

static int compareStringsInUtf8(QStringView lhs, QStringView rhs, Comparison mode) noexcept
{
    if (mode == Comparison::ForEquality)
        return lhs == rhs ? 0 : 1;

    // The UTF-16 length is *usually* comparable, but not always. There are
    // pathological cases where they can be wrong, so we need to compare as if
    // we were doing it in UTF-8. That includes the case of UTF-16 surrogate
    // pairs, because qstring.cpp sorts them before U+E000-U+FFFF.
    int diff = 0;
    qsizetype len1 = 0;
    qsizetype len2 = 0;
    const char16_t *src1 = lhs.utf16();
    const char16_t *src2 = rhs.utf16();
    const char16_t *end1 = src1 + lhs.size();
    const char16_t *end2 = src2 + rhs.size();

    // first, scan until we find a difference (if any)
    do {
        auto r1 = nextUtf32Character(src1, end1);
        auto r2 = nextUtf32Character(src2, end2);
        len1 += r1.len;
        len2 += r2.len;
        diff = int(r1.c) - int(r2.c);       // no underflow due to limited range
    } while (src1 < end1 && src2 < end2 && diff == 0);

    // compute the full length past this first difference
    len1 += stringLengthInUtf8(src1, end1);
    len2 += stringLengthInUtf8(src2, end2);
    if (len1 == len2)
        return diff;
    return len1 < len2 ? -1 : 1;
}